

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

void Cloud_CacheAllocate(CloudManager *dd,CloudOper oper,int logratio)

{
  int iVar1;
  
  if (logratio < 1) {
    __assert_fail("logratio > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                  ,0xc5,"void Cloud_CacheAllocate(CloudManager *, CloudOper, int)");
  }
  iVar1 = dd->bitsNode - logratio;
  if (iVar1 != 0 && logratio <= dd->bitsNode) {
    dd->bitsCache[oper] = iVar1;
    dd->shiftCache[oper] = 0x20 - iVar1;
    cloudCacheAllocate(dd,oper);
    return;
  }
  __assert_fail("logratio < dd->bitsNode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                ,0xc6,"void Cloud_CacheAllocate(CloudManager *, CloudOper, int)");
}

Assistant:

void Cloud_CacheAllocate( CloudManager * dd, CloudOper oper, int logratio )
{
    assert( logratio > 0 );            // cache cannot be larger than the unique table 
    assert( logratio < dd->bitsNode ); // cache cannot be smaller than 2 entries

    if ( logratio )
    {
        dd->bitsCache[oper]  = dd->bitsNode - logratio;
        dd->shiftCache[oper] = 8*sizeof(unsigned) - dd->bitsCache[oper];
    }
    cloudCacheAllocate( dd, oper );
}